

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::updateExtensionBehavior
          (TParseVersions *this,char *extension,TExtensionBehavior behavior)

{
  anon_enum_32 aVar1;
  bool bVar2;
  int iVar3;
  TSourceLoc *pTVar4;
  pointer ppVar5;
  _Self local_70;
  pool_allocator<char> local_68;
  key_type local_60;
  _Self local_38;
  iterator iter_1;
  _Self local_28;
  iterator iter;
  TExtensionBehavior behavior_local;
  char *extension_local;
  TParseVersions *this_local;
  
  iter._M_node._4_4_ = behavior;
  iVar3 = strcmp(extension,"all");
  if (iVar3 == 0) {
    if ((iter._M_node._4_4_ == EBhRequire) || (iter._M_node._4_4_ == EBhEnable)) {
      pTVar4 = getCurrentLoc(this);
      (*this->_vptr_TParseVersions[0x2d])
                (this,pTVar4,"extension \'all\' cannot have \'require\' or \'enable\' behavior",
                 "#extension","");
    }
    else {
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
           ::begin(&(this->extensionBehavior).
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                  );
      while( true ) {
        iter_1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                 ::end(&(this->extensionBehavior).
                        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                      );
        bVar2 = std::operator!=(&local_28,&iter_1);
        aVar1 = iter._M_node._4_4_;
        if (!bVar2) break;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>
                 ::operator->(&local_28);
        ppVar5->second = aVar1;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>
        ::operator++(&local_28);
      }
    }
  }
  else {
    pool_allocator<char>::pool_allocator(&local_68);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_60,
               extension,&local_68);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
         ::find(&(this->extensionBehavior).
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                ,&local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_60);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
         ::end(&(this->extensionBehavior).
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
              );
    bVar2 = std::operator==(&local_38,&local_70);
    if (bVar2) {
      if (iter._M_node._4_4_ == EBhRequire) {
        pTVar4 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2d])
                  (this,pTVar4,"extension not supported:","#extension",extension);
      }
      else {
        if (2 < iter._M_node._4_4_ - EBhEnable) {
          __assert_fail("0 && \"unexpected behavior\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Versions.cpp"
                        ,0x452,
                        "virtual void glslang::TParseVersions::updateExtensionBehavior(const char *, TExtensionBehavior)"
                       );
        }
        pTVar4 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2e])
                  (this,pTVar4,"extension not supported:","#extension",extension);
      }
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>
               ::operator->(&local_38);
      if (ppVar5->second == EBhDisablePartial) {
        pTVar4 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2e])
                  (this,pTVar4,"extension is only partially supported:","#extension",extension);
      }
      if (iter._M_node._4_4_ != EBhDisable) {
        TIntermediate::addRequestedExtension(this->intermediate,extension);
      }
      aVar1 = iter._M_node._4_4_;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>
               ::operator->(&local_38);
      ppVar5->second = aVar1;
    }
  }
  return;
}

Assistant:

void TParseVersions::updateExtensionBehavior(const char* extension, TExtensionBehavior behavior)
{
    // Update the current behavior
    if (strcmp(extension, "all") == 0) {
        // special case for the 'all' extension; apply it to every extension present
        if (behavior == EBhRequire || behavior == EBhEnable) {
            error(getCurrentLoc(), "extension 'all' cannot have 'require' or 'enable' behavior", "#extension", "");
            return;
        } else {
            for (auto iter = extensionBehavior.begin(); iter != extensionBehavior.end(); ++iter)
                iter->second = behavior;
        }
    } else {
        // Do the update for this single extension
        auto iter = extensionBehavior.find(TString(extension));
        if (iter == extensionBehavior.end()) {
            switch (behavior) {
            case EBhRequire:
                error(getCurrentLoc(), "extension not supported:", "#extension", extension);
                break;
            case EBhEnable:
            case EBhWarn:
            case EBhDisable:
                warn(getCurrentLoc(), "extension not supported:", "#extension", extension);
                break;
            default:
                assert(0 && "unexpected behavior");
            }

            return;
        } else {
            if (iter->second == EBhDisablePartial)
                warn(getCurrentLoc(), "extension is only partially supported:", "#extension", extension);
            if (behavior != EBhDisable)
                intermediate.addRequestedExtension(extension);
            iter->second = behavior;
        }
    }
}